

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagator.cpp
# Opt level: O3

void __thiscall spvtools::opt::SSAPropagator::AddControlEdge(SSAPropagator *this,Edge *edge)

{
  iterator *piVar1;
  BasicBlock *pBVar2;
  IRContext *this_00;
  _Elt_pointer ppBVar3;
  pair<std::_Rb_tree_iterator<spvtools::opt::Edge>,_bool> pVar4;
  BasicBlock *dest_bb;
  BasicBlock *local_28;
  
  pBVar2 = edge->dest;
  this_00 = this->ctx_;
  local_28 = pBVar2;
  if ((this_00->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
    IRContext::BuildCFG(this_00);
  }
  if (pBVar2 != &((this_00->cfg_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>
                  .super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl)->
                 pseudo_exit_block_) {
    pVar4 = std::
            _Rb_tree<spvtools::opt::Edge,spvtools::opt::Edge,std::_Identity<spvtools::opt::Edge>,std::less<spvtools::opt::Edge>,std::allocator<spvtools::opt::Edge>>
            ::_M_insert_unique<spvtools::opt::Edge_const&>
                      ((_Rb_tree<spvtools::opt::Edge,spvtools::opt::Edge,std::_Identity<spvtools::opt::Edge>,std::less<spvtools::opt::Edge>,std::allocator<spvtools::opt::Edge>>
                        *)&this->executable_edges_,edge);
    if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      ppBVar3 = (this->blocks_).c.
                super__Deque_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (ppBVar3 ==
          (this->blocks_).c.
          super__Deque_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>>::
        _M_push_back_aux<spvtools::opt::BasicBlock*const&>
                  ((deque<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>> *)
                   &this->blocks_,&local_28);
      }
      else {
        *ppBVar3 = pBVar2;
        piVar1 = &(this->blocks_).c.
                  super__Deque_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                  ._M_impl.super__Deque_impl_data._M_finish;
        piVar1->_M_cur = piVar1->_M_cur + 1;
      }
    }
  }
  return;
}

Assistant:

void SSAPropagator::AddControlEdge(const Edge& edge) {
  BasicBlock* dest_bb = edge.dest;

  // Refuse to add the exit block to the work list.
  if (dest_bb == ctx_->cfg()->pseudo_exit_block()) {
    return;
  }

  // Try to mark the edge executable.  If it was already in the set of
  // executable edges, do nothing.
  if (!MarkEdgeExecutable(edge)) {
    return;
  }

  // If the edge had not already been marked executable, add the destination
  // basic block to the work list.
  blocks_.push(dest_bb);
}